

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dump_nodes(nodes_list_t *n)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Self local_20;
  _Self local_18;
  const_iterator i;
  nodes_list_t *n_local;
  
  i._M_node = (_List_node_base *)n;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(n);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                   (i._M_node);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cerr,"(");
    ppVar3 = std::_List_const_iterator<std::pair<int,_int>_>::operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->first);
    poVar2 = std::operator<<(poVar2,", ");
    ppVar3 = std::_List_const_iterator<std::pair<int,_int>_>::operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    std::operator<<(poVar2,") ");
    std::_List_const_iterator<std::pair<int,_int>_>::operator++(&local_18,0);
  }
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void dump_nodes(const nodes_list_t& n)
{
    nodes_list_t::const_iterator i = n.begin();
    while (i != n.end())
    {
        std::cerr << "(" << i->first << ", " << i->second << ") ";
        i++;
    }
    std::cerr << std::endl;
}